

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement.cpp
# Opt level: O2

void __thiscall Measurement_powroot_Test::Measurement_powroot_Test(Measurement_powroot_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_001ad728;
  return;
}

Assistant:

TEST(Measurement, powroot)
{
    measurement m1(2.0, m);

    auto v1 = pow(m1, 3);
    EXPECT_EQ(v1.value(), 8.0);
    EXPECT_EQ(v1.units(), m.pow(3));
#ifndef UNITS_HEADER_ONLY
    auto m2 = root(v1, 3);
    EXPECT_TRUE(m2 == m1);

    auto m0 = root(v1, 0);
    EXPECT_EQ(m0.value(), 1.0);
    EXPECT_EQ(m0.units(), one);

    measurement m4(16.0, m.pow(2));
    EXPECT_EQ(sqrt(m4), measurement(4.0, m));

    measurement mneg(-0.25, m.pow(6));
    EXPECT_FALSE(is_valid(root(mneg, 2)));
    EXPECT_FALSE(is_valid(root(mneg, -2)));
    EXPECT_FALSE(is_valid(root(mneg, 4)));
    EXPECT_FALSE(is_valid(root(mneg, -4)));
    EXPECT_FALSE(is_valid(root(mneg, 6)));
    EXPECT_FALSE(is_valid(root(mneg, -6)));
    EXPECT_TRUE(is_valid(root(mneg, 0)));
    EXPECT_TRUE(is_valid(root(mneg, 1)));
    EXPECT_TRUE(is_valid(root(mneg, -1)));
    EXPECT_TRUE(is_valid(root(mneg, 3)));
    EXPECT_TRUE(is_valid(root(mneg, -3)));
#endif
}